

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_77::AsyncTee::ReadSink::fill
          (ReadSink *this,Buffer *inBuffer,
          Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_> *stoppage)

{
  bool bVar1;
  Exception *t;
  uint64_t in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar2;
  Promise<void> PVar3;
  Exception local_198;
  OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> *local_40;
  OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> *reason;
  uint64_t local_30;
  uint64_t amount;
  Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_> *stoppage_local;
  Buffer *inBuffer_local;
  ReadSink *this_local;
  
  amount = in_RCX;
  stoppage_local = stoppage;
  inBuffer_local = inBuffer;
  this_local = this;
  local_30 = Buffer::consume((Buffer *)stoppage,
                             (ArrayPtr<unsigned_char> *)
                             &(inBuffer->bufferList).
                              super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_first,
                             (size_t *)
                             &(inBuffer->bufferList).
                              super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node);
  (inBuffer->bufferList).
  super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur =
       (_Elt_pointer)
       ((long)&((inBuffer->bufferList).
                super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur)->ptr + local_30);
  if ((inBuffer->bufferList).
      super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>.
      _M_impl.super__Deque_impl_data._M_start._M_node == (_Map_pointer)0x0) {
    SinkBase<unsigned_long>::fulfill<unsigned_long>
              ((SinkBase<unsigned_long> *)inBuffer,
               (unsigned_long)
               (inBuffer->bufferList).
               super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur);
    Promise<void>::Promise((Promise<void> *)this);
    pPVar2 = extraout_RDX;
  }
  else {
    if ((local_30 == 0) && (bVar1 = Buffer::empty((Buffer *)stoppage_local), bVar1)) {
      local_40 = kj::_::readMaybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,kj::Exception>>
                           ((Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_>
                             *)amount);
      if (local_40 != (OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> *)0x0) {
        bVar1 = OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>::
                is<kj::(anonymous_namespace)::AsyncTee::Eof>(local_40);
        if ((bVar1) ||
           ((inBuffer->bufferList).
            super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur != (_Elt_pointer)0x0)) {
          SinkBase<unsigned_long>::fulfill<unsigned_long>
                    ((SinkBase<unsigned_long> *)inBuffer,
                     (unsigned_long)
                     (inBuffer->bufferList).
                     super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur);
        }
        else {
          t = OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>::get<kj::Exception>
                        (local_40);
          cp<kj::Exception>(&local_198,t);
          SinkBase<unsigned_long>::reject((SinkBase<unsigned_long> *)inBuffer,&local_198);
          Exception::~Exception(&local_198);
        }
        Promise<void>::Promise((Promise<void> *)this);
        pPVar2 = extraout_RDX_00;
        goto LAB_0096c69d;
      }
      local_40 = (OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception> *)0x0;
    }
    Promise<void>::Promise((Promise<void> *)this);
    pPVar2 = extraout_RDX_01;
  }
LAB_0096c69d:
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar3.super_PromiseBase.node;
}

Assistant:

Promise<void> fill(Buffer& inBuffer, const Maybe<Stoppage>& stoppage) override {
      auto amount = inBuffer.consume(buffer, minBytes);
      readSoFar += amount;

      if (minBytes == 0) {
        // We satisfied the read request.
        fulfill(readSoFar);
        return READY_NOW;
      }

      if (amount == 0 && inBuffer.empty()) {
        // We made no progress on the read request and the buffer is tapped out.
        KJ_IF_MAYBE(reason, stoppage) {
          if (reason->is<Eof>() || readSoFar > 0) {
            // Prefer short read to exception.
            fulfill(readSoFar);
          } else {
            reject(cp(reason->get<Exception>()));
          }
          return READY_NOW;
        }
      }

      return READY_NOW;
    }